

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

RegexMatcher * __thiscall
icu_63::RegexMatcher::refreshInputText(RegexMatcher *this,UText *input,UErrorCode *status)

{
  int64_t iVar1;
  int64_t iVar2;
  UText *pUVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (input != (UText *)0x0) {
      iVar1 = utext_nativeLength_63(this->fInputText);
      iVar2 = utext_nativeLength_63(input);
      if (iVar1 == iVar2) {
        iVar1 = utext_getNativeIndex_63(this->fInputText);
        pUVar3 = utext_clone_63(this->fInputText,input,'\0','\x01',status);
        this->fInputText = pUVar3;
        if (U_ZERO_ERROR < *status) {
          return this;
        }
        utext_setNativeIndex_63(pUVar3,iVar1);
        if (this->fAltInputText == (UText *)0x0) {
          return this;
        }
        iVar1 = utext_getNativeIndex_63(this->fAltInputText);
        pUVar3 = utext_clone_63(this->fAltInputText,input,'\0','\x01',status);
        this->fAltInputText = pUVar3;
        if (U_ZERO_ERROR < *status) {
          return this;
        }
        utext_setNativeIndex_63(pUVar3,iVar1);
        return this;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::refreshInputText(UText *input, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (input == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    if (utext_nativeLength(fInputText) != utext_nativeLength(input)) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    int64_t  pos = utext_getNativeIndex(fInputText);
    //  Shallow read-only clone of the new UText into the existing input UText
    fInputText = utext_clone(fInputText, input, FALSE, TRUE, &status);
    if (U_FAILURE(status)) {
        return *this;
    }
    utext_setNativeIndex(fInputText, pos);

    if (fAltInputText != NULL) {
        pos = utext_getNativeIndex(fAltInputText);
        fAltInputText = utext_clone(fAltInputText, input, FALSE, TRUE, &status);
        if (U_FAILURE(status)) {
            return *this;
        }
        utext_setNativeIndex(fAltInputText, pos);
    }
    return *this;
}